

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O2

ON_SHA1_Hash * __thiscall
ON_ScaleValue::ContentHash(ON_SHA1_Hash *__return_storage_ptr__,ON_ScaleValue *this)

{
  ON_SHA1_Hash h;
  ON_SHA1_Hash local_bc;
  ON_SHA1 sha1;
  
  ON_SHA1::ON_SHA1(&sha1);
  ON_SHA1::AccumulateDouble(&sha1,this->m_left_to_right_scale);
  ON_SHA1::AccumulateDouble(&sha1,this->m_right_to_left_scale);
  ON_SHA1::AccumulateUnsigned32(&sha1,this->m_context_locale_id);
  ON_SHA1::AccumulateUnsigned32(&sha1,(uint)this->m_context_length_unit_system);
  ON_SHA1::AccumulateUnsigned32(&sha1,(uint)this->m_context_angle_unit_system);
  ON_SHA1::AccumulateUnsigned32(&sha1,(uint)this->m_string_format_preference);
  ON_wString::IsValid(&this->m_scale_as_string,true);
  ON_SHA1::AccumulateString(&sha1,&this->m_scale_as_string);
  ON_LengthValue::ContentHash(&h,&this->m_left_length);
  ON_SHA1::AccumulateSubHash(&sha1,&h);
  ON_LengthValue::ContentHash(&local_bc,&this->m_right_length);
  h.m_digest[0x10] = local_bc.m_digest[0x10];
  h.m_digest[0x11] = local_bc.m_digest[0x11];
  h.m_digest[0x12] = local_bc.m_digest[0x12];
  h.m_digest[0x13] = local_bc.m_digest[0x13];
  h.m_digest[0] = local_bc.m_digest[0];
  h.m_digest[1] = local_bc.m_digest[1];
  h.m_digest[2] = local_bc.m_digest[2];
  h.m_digest[3] = local_bc.m_digest[3];
  h.m_digest[4] = local_bc.m_digest[4];
  h.m_digest[5] = local_bc.m_digest[5];
  h.m_digest[6] = local_bc.m_digest[6];
  h.m_digest[7] = local_bc.m_digest[7];
  h.m_digest[8] = local_bc.m_digest[8];
  h.m_digest[9] = local_bc.m_digest[9];
  h.m_digest[10] = local_bc.m_digest[10];
  h.m_digest[0xb] = local_bc.m_digest[0xb];
  h.m_digest[0xc] = local_bc.m_digest[0xc];
  h.m_digest[0xd] = local_bc.m_digest[0xd];
  h.m_digest[0xe] = local_bc.m_digest[0xe];
  h.m_digest[0xf] = local_bc.m_digest[0xf];
  ON_SHA1::AccumulateSubHash(&sha1,&h);
  ON_SHA1::Hash(__return_storage_ptr__,&sha1);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_ScaleValue::ContentHash() const
{
  ON_SHA1 sha1;
  sha1.AccumulateDouble(m_left_to_right_scale);
  sha1.AccumulateDouble(m_right_to_left_scale);
  sha1.AccumulateUnsigned32(m_context_locale_id);
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_context_length_unit_system));
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_context_angle_unit_system));
  sha1.AccumulateUnsigned32(static_cast<unsigned int>(m_string_format_preference));
  m_scale_as_string.IsValid(true);
  sha1.AccumulateString(m_scale_as_string);
  ON_SHA1_Hash h = m_left_length.ContentHash();
  sha1.AccumulateSubHash(h);
  h = m_right_length.ContentHash();
  sha1.AccumulateSubHash(h);
  return sha1.Hash();
}